

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

ssize_t __thiscall MeshLib::Solid::read(Solid *this,int __fd,void *__buf,size_t __nbytes)

{
  double dVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  undefined4 extraout_var;
  size_t sVar5;
  double *pdVar6;
  tVertex pVVar7;
  Point *pPVar8;
  int *piVar9;
  char *pcVar10;
  string *psVar11;
  tFace f_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  string local_a00 [36];
  int local_9dc;
  int local_9d8;
  int ep_3;
  int sp_3;
  string s_3;
  tHalfEdge he;
  Face *f_1;
  Vertex *v_2;
  int id1_1;
  int id0_1;
  int local_96c;
  int local_968;
  int ep_2;
  int sp_2;
  string s_2;
  tEdge edge;
  int id1;
  int id0;
  int local_90c;
  int local_908;
  int ep_1;
  int sp_1;
  string s_1;
  tFace f;
  int i_1;
  int v_1 [3];
  int ep;
  int sp;
  string s;
  tVertex v;
  int local_854;
  undefined1 auStack_850 [4];
  int i;
  Point p;
  char *str;
  char local_828 [4];
  int id;
  char line [2048];
  FILE *is;
  char *input_local;
  Solid *this_local;
  ssize_t sVar4;
  
  __stream = fopen((char *)CONCAT44(in_register_00000034,__fd),"r");
  if (__stream == (FILE *)0x0) {
    iVar2 = fprintf(_stderr,"Error is opening file %s\n",(char *)CONCAT44(in_register_00000034,__fd)
                   );
    sVar4 = CONCAT44(extraout_var,iVar2);
  }
  else {
    while (iVar2 = feof(__stream), iVar2 == 0) {
      fgets(local_828,0x800,__stream);
      iVar2 = feof(__stream);
      if ((iVar2 != 0) || (sVar5 = strlen(local_828), sVar5 == 0)) break;
      p.v[2] = (double)strtok(local_828," \r\n\t");
      iVar2 = strcmp((char *)p.v[2],"Vertex");
      if (iVar2 == 0) {
        p.v[2] = (double)strtok((char *)0x0," \r\n\t");
        iVar2 = atoi((char *)p.v[2]);
        Point::Point((Point *)auStack_850);
        for (local_854 = 0; local_854 < 3; local_854 = local_854 + 1) {
          p.v[2] = (double)strtok((char *)0x0," \r\n\t");
          dVar1 = atof((char *)p.v[2]);
          pdVar6 = Point::operator[]((Point *)auStack_850,local_854);
          *pdVar6 = dVar1;
        }
        pVVar7 = createVertex(this,iVar2);
        pPVar8 = Vertex::point(pVVar7);
        pPVar8->v[2] = p.v[1];
        pPVar8->v[0] = _auStack_850;
        pPVar8->v[1] = p.v[0];
        piVar9 = Vertex::id(pVVar7);
        *piVar9 = iVar2;
        pcVar10 = strtok((char *)0x0,"\r\n\t");
        p.v[2] = (double)pcVar10;
        if (pcVar10 == (char *)0x0) {
          s.field_2._12_4_ = 2;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&sp,pcVar10,(allocator *)((long)&ep + 3));
          std::allocator<char>::~allocator((allocator<char> *)((long)&ep + 3));
          iVar2 = std::__cxx11::string::find((char *)&sp,0x133748);
          iVar3 = std::__cxx11::string::find((char *)&sp,0x13379e);
          if ((-1 < iVar2) && (-1 < iVar3)) {
            std::__cxx11::string::substr((ulong)(v_1 + 1),(ulong)&sp);
            psVar11 = Vertex::string_abi_cxx11_(pVVar7);
            std::__cxx11::string::operator=((string *)psVar11,(string *)(v_1 + 1));
            std::__cxx11::string::~string((string *)(v_1 + 1));
          }
          s.field_2._12_4_ = 2;
          std::__cxx11::string::~string((string *)&sp);
        }
        Point::~Point((Point *)auStack_850);
      }
      else {
        iVar2 = strcmp((char *)p.v[2],"Face");
        if (iVar2 == 0) {
          p.v[2] = (double)strtok((char *)0x0," \r\n\t");
          iVar2 = atoi((char *)p.v[2]);
          for (f._0_4_ = 0; (int)f < 3; f._0_4_ = (int)f + 1) {
            p.v[2] = (double)strtok((char *)0x0," \r\n\t");
            iVar3 = atoi((char *)p.v[2]);
            *(int *)((long)&f + (long)(int)f * 4 + 4) = iVar3;
          }
          s_1.field_2._8_8_ = createFace(this,(int *)((long)&f + 4),iVar2);
          p.v[2] = (double)strtok((char *)0x0,"\r\n\t");
          if (((char *)p.v[2] != (char *)0x0) &&
             (sVar5 = strlen((char *)p.v[2]), dVar1 = p.v[2], sVar5 != 0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&sp_1,(char *)dVar1,(allocator *)((long)&ep_1 + 3));
            std::allocator<char>::~allocator((allocator<char> *)((long)&ep_1 + 3));
            local_908 = std::__cxx11::string::find((char *)&sp_1,0x133748);
            local_90c = std::__cxx11::string::find((char *)&sp_1,0x13379e);
            if ((-1 < local_908) && (-1 < local_90c)) {
              std::__cxx11::string::substr((ulong)&id1,(ulong)&sp_1);
              psVar11 = Face::string_abi_cxx11_((Face *)s_1.field_2._8_8_);
              std::__cxx11::string::operator=((string *)psVar11,(string *)&id1);
              std::__cxx11::string::~string((string *)&id1);
            }
            s.field_2._12_4_ = 2;
            std::__cxx11::string::~string((string *)&sp_1);
          }
        }
        else {
          iVar2 = strcmp((char *)p.v[2],"Edge");
          if (iVar2 == 0) {
            p.v[2] = (double)strtok((char *)0x0," \r\n\t");
            iVar2 = atoi((char *)p.v[2]);
            p.v[2] = (double)strtok((char *)0x0," \r\n\t");
            iVar3 = atoi((char *)p.v[2]);
            s_2.field_2._8_8_ = idEdge(this,iVar2,iVar3);
            pcVar10 = strtok((char *)0x0,"\r\n\t");
            p.v[2] = (double)pcVar10;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&sp_2,pcVar10,(allocator *)((long)&ep_2 + 3));
            std::allocator<char>::~allocator((allocator<char> *)((long)&ep_2 + 3));
            local_968 = std::__cxx11::string::find((char *)&sp_2,0x133748);
            local_96c = std::__cxx11::string::find((char *)&sp_2,0x13379e);
            if ((-1 < local_968) && (-1 < local_96c)) {
              std::__cxx11::string::substr((ulong)&id1_1,(ulong)&sp_2);
              psVar11 = Edge::string_abi_cxx11_((Edge *)s_2.field_2._8_8_);
              std::__cxx11::string::operator=((string *)psVar11,(string *)&id1_1);
              std::__cxx11::string::~string((string *)&id1_1);
            }
            s.field_2._12_4_ = 2;
            std::__cxx11::string::~string((string *)&sp_2);
          }
          else {
            iVar2 = strcmp((char *)p.v[2],"Corner");
            if (iVar2 == 0) {
              p.v[2] = (double)strtok((char *)0x0," \r\n\t");
              iVar2 = atoi((char *)p.v[2]);
              p.v[2] = (double)strtok((char *)0x0," \r\n\t");
              iVar3 = atoi((char *)p.v[2]);
              pVVar7 = idVertex(this,iVar2);
              f_00 = idFace(this,iVar3);
              s_3.field_2._8_8_ = corner(this,pVVar7,f_00);
              pcVar10 = strtok((char *)0x0,"\r\n\t");
              p.v[2] = (double)pcVar10;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&sp_3,pcVar10,(allocator *)((long)&ep_3 + 3));
              std::allocator<char>::~allocator((allocator<char> *)((long)&ep_3 + 3));
              local_9d8 = std::__cxx11::string::find((char *)&sp_3,0x133748);
              local_9dc = std::__cxx11::string::find((char *)&sp_3,0x13379e);
              if ((-1 < local_9d8) && (-1 < local_9dc)) {
                std::__cxx11::string::substr((ulong)local_a00,(ulong)&sp_3);
                psVar11 = HalfEdge::string_abi_cxx11_((HalfEdge *)s_3.field_2._8_8_);
                std::__cxx11::string::operator=((string *)psVar11,local_a00);
                std::__cxx11::string::~string(local_a00);
              }
              s.field_2._12_4_ = 2;
              std::__cxx11::string::~string((string *)&sp_3);
            }
          }
        }
      }
    }
    labelBoundaryEdges(this);
    removeDanglingVertices(this);
    sVar4 = extraout_RAX;
  }
  return sVar4;
}

Assistant:

void Solid::read( const char * input ) {
	FILE * is = fopen( input, "r" );
	if( is == NULL ) {
		fprintf(stderr,"Error is opening file %s\n", input );
		return;
	}

	char line[MAX_LINE];
	int id;

	while( !feof(is)  ) {		
		fgets( line, MAX_LINE, is );
		if(  feof(is) || strlen( line ) == 0  ) break;

		char * str = strtok( line, " \r\n\t");
		if( strcmp(str, "Vertex" ) == 0 ) 
		{
			
			str = strtok(NULL," \r\n\t");

			id = atoi( str );


			Point p;
			for( int i = 0 ; i < 3; i ++ )
			{
				str = strtok(NULL," \r\n\t");
				p[i] = atof( str );
			}
		
			tVertex v  = createVertex( id );
			
			v->point() = p;
			v->id()    = id;

			str = strtok( NULL, "\r\n\t");

			if( str == NULL ) continue;

			std::string s(str);
			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				v->string() = s.substr( sp+1, ep-sp-1 );
			}

			continue;

		}
		

		if( strcmp(str,"Face") == 0 ) {
			str = strtok(NULL, " \r\n\t");

			id = atoi( str );
			
	
			int v[3];
			for( int i = 0; i < 3; i ++ ) {
				str = strtok(NULL," \r\n\t");
				v[i] = atoi( str );
			}

			tFace f = createFace( v, id );
			
			str = strtok( NULL, "\r\n\t");
			if ( str== NULL || strlen( str ) == 0 ) continue;

			std::string s(str);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 ) {
				f->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}

		//read in edge attributes
		if( strcmp(str,"Edge")==0 ) {
			str = strtok(NULL, " \r\n\t");
			int id0 = atoi( str );

			str = strtok(NULL, " \r\n\t");
			int id1 = atoi( str );

			tEdge edge = idEdge( id0, id1 );
			

			str = strtok(NULL, "\r\n\t");

			std::string s(str);
			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 ) {
				edge->string() = s.substr( sp+1, ep-sp-1 );
			}
			
			continue;

		}

		//read in edge attributes
		if( strcmp(str,"Corner")==0 ) {
			str = strtok(NULL," \r\n\t");
			int id0 = atoi( str );
				
			str = strtok(NULL," \r\n\t");
			int id1 = atoi( str );


			Vertex * v = idVertex( id0 );
			Face   * f = idFace( id1 );
			tHalfEdge he = corner( v, f );

			str = strtok(NULL,"\r\n\t");
			std::string s(str);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				he->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}


	}

	
	labelBoundaryEdges();
	removeDanglingVertices();


}